

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O1

void RunScope(int count)

{
  int iVar1;
  Function *in_RAX;
  Function *local_38;
  
  if (0 < count) {
    local_38 = in_RAX;
    do {
      iVar1 = rand();
      iVar1 = iVar1 % 100;
      if (iVar1 < 0xf) {
        RandomValue(false);
      }
      else if (iVar1 < 0x14) {
        local_38 = RandomFunction();
        if (g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<luna::Function*,std::allocator<luna::Function*>>::
          _M_push_back_aux<luna::Function*>
                    ((deque<luna::Function*,std::allocator<luna::Function*>> *)&g_globalFunction,
                     &local_38);
        }
        else {
          *g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur = local_38;
          g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur =
               g_globalFunction.
               super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      else if (iVar1 < 0x1e) {
        local_38 = (Function *)RandomString();
        if (g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur ==
            g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<luna::String*,std::allocator<luna::String*>>::_M_push_back_aux<luna::String*>
                    ((deque<luna::String*,std::allocator<luna::String*>> *)&g_scopeString,
                     (String **)&local_38);
        }
        else {
          *g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur = (String *)local_38;
          g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur =
               g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      else if (iVar1 < 0x28) {
        local_38 = (Function *)RandomClosure();
        if (g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<luna::Closure*,std::allocator<luna::Closure*>>::
          _M_push_back_aux<luna::Closure*>
                    ((deque<luna::Closure*,std::allocator<luna::Closure*>> *)&g_scopeClosure,
                     (Closure **)&local_38);
        }
        else {
          *g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur = (Closure *)local_38;
          g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur =
               g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      else if (iVar1 < 0x32) {
        local_38 = (Function *)RandomTable();
        if (g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<luna::Table*,std::allocator<luna::Table*>>::_M_push_back_aux<luna::Table*>
                    ((deque<luna::Table*,std::allocator<luna::Table*>> *)&g_scopeTable,
                     (Table **)&local_38);
        }
        else {
          *g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur = (Table *)local_38;
          g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur =
               g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl
               .super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      else if (iVar1 < 0x37) {
        NewObjInGlobal();
      }
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void RunScope(int count)
{
    for (int i = 0; i < count; ++i)
    {
        int percent = RandomRange(1, 100);
        if (percent <= 15)
            RandomValue();
        else if (percent <= 20)
            g_globalFunction.push_back(RandomFunction());
        else if (percent <= 30)
            g_scopeString.push_back(RandomString());
        else if (percent <= 40)
            g_scopeClosure.push_back(RandomClosure());
        else if (percent <= 50)
            g_scopeTable.push_back(RandomTable());
        else if (percent <= 55)
            NewObjInGlobal();
    }
}